

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall
PrintfTest_FloatPrecision_Test::~PrintfTest_FloatPrecision_Test
          (PrintfTest_FloatPrecision_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_FloatPrecision_Test((PrintfTest_FloatPrecision_Test *)0x140928);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, FloatPrecision) {
  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%.3e", 1234.5678);
  EXPECT_PRINTF(buffer, "%.3e", 1234.5678);
  EXPECT_PRINTF("1234.568", "%.3f", 1234.5678);
  safe_sprintf(buffer, "%.3g", 1234.5678);
  EXPECT_PRINTF(buffer, "%.3g", 1234.5678);
  safe_sprintf(buffer, "%.3a", 1234.5678);
  EXPECT_PRINTF(buffer, "%.3a", 1234.5678);
}